

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

IfcVector3 *
Assimp::IFC::TempMesh::ComputePolygonNormal
          (IfcVector3 *__return_storage_ptr__,IfcVector3 *vtcs,size_t cnt,bool normalize)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> temp;
  allocator_type local_39;
  vector<double,_std::allocator<double>_> local_38;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_38,cnt * 3 + 6,&local_39);
  if (cnt != 0) {
    lVar2 = 0;
    sVar4 = cnt;
    do {
      *(undefined8 *)
       ((long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2) = *(undefined8 *)((long)&vtcs->x + lVar2);
      *(undefined8 *)
       ((long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2 + 8) =
           *(undefined8 *)((long)&vtcs->y + lVar2);
      *(undefined8 *)
       ((long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2 + 0x10) =
           *(undefined8 *)((long)&vtcs->z + lVar2);
      lVar2 = lVar2 + 0x18;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  iVar1 = (int)cnt;
  lVar2 = (long)(iVar1 * 3);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar2] =
       *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start;
  lVar5 = (long)(iVar1 * 3 + 3);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar5] =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[3];
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar2 + 1] =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[1];
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar5 + 1] =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[4];
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar2 + 2] =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[2];
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar5 + 2] =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start[5];
  if (iVar1 < 1) {
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar9 = 0.0;
  }
  else {
    pdVar3 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 8;
    dVar7 = 0.0;
    dVar8 = 0.0;
    dVar9 = 0.0;
    do {
      dVar9 = dVar9 + (pdVar3[-1] - pdVar3[-7]) * pdVar3[-5];
      dVar7 = dVar7 + (*pdVar3 - pdVar3[-6]) * pdVar3[-4];
      dVar8 = dVar8 + (pdVar3[-2] - pdVar3[-8]) * pdVar3[-3];
      pdVar3 = pdVar3 + 3;
      uVar6 = (int)cnt - 1;
      cnt = (size_t)uVar6;
    } while (uVar6 != 0);
  }
  if (normalize) {
    dVar10 = 1.0 / SQRT(dVar9 * dVar9 + dVar7 * dVar7 + dVar8 * dVar8);
    dVar9 = dVar9 * dVar10;
    dVar7 = dVar7 * dVar10;
    dVar8 = dVar8 * dVar10;
  }
  __return_storage_ptr__->x = dVar7;
  __return_storage_ptr__->y = dVar8;
  __return_storage_ptr__->z = dVar9;
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 TempMesh::ComputePolygonNormal(const IfcVector3* vtcs, size_t cnt, bool normalize)
{
    std::vector<IfcFloat> temp((cnt+2)*3);
    for( size_t vofs = 0, i = 0; vofs < cnt; ++vofs )
    {
        const IfcVector3& v = vtcs[vofs];
        temp[i++] = v.x;
        temp[i++] = v.y;
        temp[i++] = v.z;
    }

    IfcVector3 nor;
    NewellNormal<3, 3, 3>(nor, static_cast<int>(cnt), &temp[0], &temp[1], &temp[2]);
    return normalize ? nor.Normalize() : nor;
}